

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

PgHdr * sqlite3PcacheDirtyList(PCache *pCache)

{
  PgHdr **ppPVar1;
  uint uVar2;
  PgHdr *pPVar3;
  PgHdr *pPVar4;
  PgHdr *pPVar5;
  long lVar6;
  PgHdr *pPVar7;
  PgHdr *pPVar8;
  PgHdr *pPVar9;
  bool bVar10;
  PgHdr result;
  PgHdr PStack_158;
  PgHdr *local_108 [32];
  
  pPVar8 = pCache->pDirty;
  while (pPVar8 != (PgHdr *)0x0) {
    pPVar8->pDirty = pPVar8->pDirtyNext;
    pPVar8 = pPVar8->pDirtyNext;
  }
  pPVar8 = pCache->pDirty;
  memset(local_108,0,0x100);
  do {
    if (pPVar8 == (PgHdr *)0x0) {
      lVar6 = 1;
      do {
        pPVar8 = local_108[lVar6];
        pPVar3 = local_108[0];
        if ((pPVar8 != (PgHdr *)0x0) &&
           (pPVar3 = pPVar8, pPVar5 = &PStack_158, local_108[0] != (PgHdr *)0x0)) {
          do {
            pPVar3 = local_108[0];
            uVar2 = pPVar3->pgno;
            while (pPVar8->pgno <= uVar2) {
              pPVar5->pDirty = pPVar8;
              ppPVar1 = &pPVar8->pDirty;
              pPVar7 = pPVar3;
              pPVar5 = pPVar8;
              pPVar8 = *ppPVar1;
              if (*ppPVar1 == (PgHdr *)0x0) goto LAB_00139653;
            }
            pPVar5->pDirty = pPVar3;
            local_108[0] = pPVar3->pDirty;
            pPVar7 = pPVar8;
            pPVar5 = pPVar3;
          } while (pPVar3->pDirty != (PgHdr *)0x0);
LAB_00139653:
          pPVar5->pDirty = pPVar7;
          pPVar3 = PStack_158.pDirty;
        }
        lVar6 = lVar6 + 1;
        local_108[0] = pPVar3;
        if (lVar6 == 0x20) {
          return pPVar3;
        }
      } while( true );
    }
    pPVar3 = pPVar8->pDirty;
    pPVar8->pDirty = (PgHdr *)0x0;
    lVar6 = 0;
    pPVar5 = pPVar8;
    do {
      pPVar8 = &PStack_158;
      pPVar7 = local_108[lVar6];
      if (local_108[lVar6] == (PgHdr *)0x0) {
        local_108[lVar6] = pPVar5;
        bVar10 = lVar6 == 0x1f;
        goto LAB_0013958d;
      }
      do {
        pPVar9 = pPVar7;
        uVar2 = pPVar9->pgno;
        while (pPVar5->pgno <= uVar2) {
          pPVar8->pDirty = pPVar5;
          ppPVar1 = &pPVar5->pDirty;
          pPVar4 = pPVar9;
          pPVar8 = pPVar5;
          pPVar5 = *ppPVar1;
          if (*ppPVar1 == (PgHdr *)0x0) goto LAB_00139562;
        }
        pPVar8->pDirty = pPVar9;
        pPVar4 = pPVar5;
        pPVar8 = pPVar9;
        pPVar7 = pPVar9->pDirty;
      } while (pPVar9->pDirty != (PgHdr *)0x0);
LAB_00139562:
      pPVar8->pDirty = pPVar4;
      local_108[lVar6] = (PgHdr *)0x0;
      lVar6 = lVar6 + 1;
      pPVar5 = PStack_158.pDirty;
    } while (lVar6 != 0x1f);
    bVar10 = true;
LAB_0013958d:
    pPVar7 = &PStack_158;
    pPVar9 = local_108[0x1f];
    pPVar8 = pPVar3;
    if (bVar10) {
      do {
        uVar2 = pPVar9->pgno;
        while (pPVar5->pgno <= uVar2) {
          pPVar7->pDirty = pPVar5;
          ppPVar1 = &pPVar5->pDirty;
          pPVar3 = pPVar9;
          pPVar7 = pPVar5;
          pPVar5 = *ppPVar1;
          if (*ppPVar1 == (PgHdr *)0x0) goto LAB_001395db;
        }
        pPVar7->pDirty = pPVar9;
        ppPVar1 = &pPVar9->pDirty;
        pPVar3 = pPVar5;
        pPVar7 = pPVar9;
        pPVar9 = *ppPVar1;
      } while (*ppPVar1 != (PgHdr *)0x0);
LAB_001395db:
      pPVar7->pDirty = pPVar3;
      local_108[0x1f] = PStack_158.pDirty;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE PgHdr *sqlite3PcacheDirtyList(PCache *pCache){
  PgHdr *p;
  for(p=pCache->pDirty; p; p=p->pDirtyNext){
    p->pDirty = p->pDirtyNext;
  }
  return pcacheSortDirtyList(pCache->pDirty);
}